

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void google::protobuf::UnknownFieldSet::MergeToInternalMetadata
               (UnknownFieldSet *other,InternalMetadata *metadata)

{
  UnknownFieldSet *this;
  
  if ((metadata->ptr_ & 1U) == 0) {
    this = internal::InternalMetadata::
           mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(metadata);
  }
  else {
    this = (UnknownFieldSet *)((metadata->ptr_ & 0xfffffffffffffffcU) + 8);
  }
  MergeFrom(this,other);
  return;
}

Assistant:

void UnknownFieldSet::MergeToInternalMetadata(
    const UnknownFieldSet& other, internal::InternalMetadata* metadata) {
  metadata->mutable_unknown_fields<UnknownFieldSet>()->MergeFrom(other);
}